

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_ls.c
# Opt level: O0

int cvLsPSolve(void *cvode_mem,N_Vector r,N_Vector z,realtype tol,int lr)

{
  undefined4 in_ECX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_XMM0_Qa;
  int retval;
  CVLsMem cvls_mem;
  CVodeMem cv_mem;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  char *in_stack_ffffffffffffffc0;
  void *in_stack_ffffffffffffffc8;
  int local_4;
  
  local_4 = cvLs_AccessLMem(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                            (CVodeMem *)
                            CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                            (CVLsMem *)0xefccb8);
  if (local_4 == 0) {
    local_4 = (**(code **)(in_stack_ffffffffffffffc0 + 0xd8))
                        (*(undefined8 *)((long)in_stack_ffffffffffffffc8 + 0x168),
                         *(undefined8 *)((long)in_stack_ffffffffffffffc8 + 0x288),in_XMM0_Qa,
                         *(undefined8 *)(in_stack_ffffffffffffffc0 + 0x70),
                         *(undefined8 *)(in_stack_ffffffffffffffc0 + 0x78),in_RSI,in_RDX,in_ECX,
                         *(undefined8 *)(in_stack_ffffffffffffffc0 + 0xe8));
    *(long *)(in_stack_ffffffffffffffc0 + 0xb0) = *(long *)(in_stack_ffffffffffffffc0 + 0xb0) + 1;
  }
  return local_4;
}

Assistant:

int cvLsPSolve(void *cvode_mem, N_Vector r, N_Vector z, realtype tol, int lr)
{
  CVodeMem cv_mem;
  CVLsMem  cvls_mem;
  int      retval;

  /* access CVLsMem structure */
  retval = cvLs_AccessLMem(cvode_mem, "cvLsPSolve",
                           &cv_mem, &cvls_mem);
  if (retval != CVLS_SUCCESS)  return(retval);

  /* call the user-supplied psolve routine, and accumulate count */
  retval = cvls_mem->psolve(cv_mem->cv_tn, cvls_mem->ycur,
                            cvls_mem->fcur, r, z,
                            cv_mem->cv_gamma, tol, lr,
                            cvls_mem->P_data);
  cvls_mem->nps++;
  return(retval);
}